

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_set.c
# Opt level: O3

int mpt_string_pset(char **ptr,mpt_convertable *src)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  iovec vec;
  char *local_20;
  int local_18;
  
  if (src == (mpt_convertable *)0x0) {
    uVar2 = 0;
    if ((ptr != (char **)0x0) && (*ptr != (char *)0x0)) {
      sVar3 = strlen(*ptr);
      uVar2 = (uint)sVar3;
    }
  }
  else {
    iVar1 = (*src->_vptr->convert)(src,0x43,&local_20);
    if (iVar1 < 1) {
      local_20 = (char *)0x0;
      uVar2 = (*src->_vptr->convert)(src,0x73,&local_20);
      if (-1 < (int)uVar2) {
        if (uVar2 == 0 || local_20 == (char *)0x0) {
          free(*ptr);
          *ptr = (char *)0x0;
          uVar2 = 0;
        }
        else {
          uVar2 = mpt_string_set(ptr,local_20,-1);
          uVar2 = uVar2 >> 0x1f;
        }
      }
    }
    else {
      uVar2 = mpt_string_set(ptr,local_20,local_18);
      uVar2 = (int)uVar2 >> 0x1f & uVar2;
    }
  }
  return uVar2;
}

Assistant:

extern int mpt_string_pset(char **ptr, MPT_INTERFACE(convertable) *src)
{
	struct iovec vec;
	int len;
	
	if (!src) {
		return (ptr && *ptr) ? strlen(*ptr) : 0;
	}
	if ((len = src->_vptr->convert(src, MPT_type_toVector('c'), &vec)) > 0) {
		if ((len = mpt_string_set(ptr, vec.iov_base, vec.iov_len)) < 0) {
			return len;
		}
		return 0;
	}
	vec.iov_base = 0;
	if ((len = src->_vptr->convert(src, 's', &vec.iov_base)) < 0) {
		return len;
	}
	if (!len || !vec.iov_base) {
		mpt_string_set(ptr, 0, 0);
	}
	else if ((len = mpt_string_set(ptr, vec.iov_base, -1) < 0)) {
		return len;
	}
	return 0;
}